

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O0

Pass * wasm::createDAEPass(void)

{
  DAE *this;
  
  this = (DAE *)operator_new(0x70);
  memset(this,0,0x70);
  DAE::DAE(this);
  return &this->super_Pass;
}

Assistant:

Pass* createDAEPass() { return new DAE(); }